

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

void tcd_makelayer(opj_tcd_t *tcd,int layno,double thresh,int final)

{
  opj_tcd_cblk_enc_t *poVar1;
  opj_tcd_pass_t *poVar2;
  int iVar3;
  int iVar4;
  opj_tcd_tile_t *poVar5;
  opj_tcd_tilecomp_t *poVar6;
  opj_tcd_resolution_t *poVar7;
  opj_tcd_precinct_t *poVar8;
  opj_tcd_cblk_enc_t *poVar9;
  opj_tcd_pass_t *poVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  uchar *puVar21;
  ulong uVar22;
  int iVar23;
  OPJ_UINT32 OVar24;
  opj_tcd_layer_t *poVar25;
  long lVar26;
  double dVar27;
  long local_a8;
  
  poVar5 = tcd->tcd_tile;
  poVar5->distolayer[layno] = 0.0;
  iVar3 = poVar5->numcomps;
  if (0 < (long)iVar3) {
    poVar6 = poVar5->comps;
    lVar19 = 0;
    do {
      lVar18 = (long)poVar6[lVar19].numresolutions;
      if (0 < lVar18) {
        poVar7 = poVar6[lVar19].resolutions;
        lVar15 = 0;
        do {
          iVar4 = poVar7[lVar15].numbands;
          if (0 < (long)iVar4) {
            uVar16 = poVar7[lVar15].ph * poVar7[lVar15].pw;
            local_a8 = 0;
            do {
              if (0 < (int)uVar16) {
                poVar8 = poVar7[lVar15].bands[local_a8].precincts;
                uVar14 = 0;
                do {
                  uVar11 = poVar8[uVar14].ch * poVar8[uVar14].cw;
                  if (0 < (int)uVar11) {
                    uVar22 = 0;
                    do {
                      poVar9 = poVar8[uVar14].cblks.enc;
                      poVar1 = poVar9 + uVar22;
                      if (layno == 0) {
                        poVar1->numpassesinlayers = 0;
                        uVar12 = 0;
                      }
                      else {
                        uVar12 = (ulong)(uint)poVar1->numpassesinlayers;
                      }
                      poVar25 = poVar9[uVar22].layers + layno;
                      iVar23 = (int)uVar12;
                      if (iVar23 < poVar1->totalpasses) {
                        poVar10 = poVar1->passes;
                        lVar26 = (long)iVar23;
                        do {
                          poVar2 = poVar10 + lVar26;
                          iVar20 = poVar2->rate;
                          iVar17 = (int)uVar12;
                          if (iVar17 == 0) {
                            dVar27 = poVar2->distortiondec;
                          }
                          else {
                            iVar20 = iVar20 - poVar10[(long)iVar17 + -1].rate;
                            dVar27 = poVar2->distortiondec -
                                     poVar10[(long)iVar17 + -1].distortiondec;
                          }
                          if (iVar20 == 0) {
                            uVar13 = lVar26 + 1U & 0xffffffff;
                            if (dVar27 == 0.0) {
                              uVar13 = uVar12;
                            }
                          }
                          else {
                            uVar13 = uVar12;
                            if (thresh <= dVar27 / (double)iVar20) {
                              uVar13 = lVar26 + 1U & 0xffffffff;
                            }
                          }
                          lVar26 = lVar26 + 1;
                          uVar12 = uVar13;
                        } while (lVar26 != poVar1->totalpasses);
                        iVar20 = (int)uVar13;
                        poVar25->numpasses = iVar20 - iVar23;
                        if (iVar20 - iVar23 == 0) goto LAB_00132928;
                        iVar17 = iVar20 + -1;
                        poVar10 = poVar1->passes;
                        OVar24 = poVar10[iVar17].rate;
                        if (iVar23 == 0) {
                          puVar21 = poVar1->data;
                          dVar27 = poVar10[iVar17].distortiondec;
                        }
                        else {
                          OVar24 = OVar24 - poVar10[(long)iVar23 + -1].rate;
                          puVar21 = poVar1->data + poVar10[(long)iVar23 + -1].rate;
                          dVar27 = poVar10[iVar17].distortiondec -
                                   poVar10[(long)iVar23 + -1].distortiondec;
                        }
                        poVar25->len = OVar24;
                        poVar25->data = puVar21;
                        poVar25->disto = (OPJ_FLOAT64)dVar27;
                        poVar5->distolayer[layno] = dVar27 + poVar5->distolayer[layno];
                        if (final != 0) {
                          poVar1->numpassesinlayers = iVar20;
                        }
                      }
                      else {
                        poVar25->numpasses = 0;
LAB_00132928:
                        poVar25->disto = 0.0;
                      }
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar11);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar16);
              }
              local_a8 = local_a8 + 1;
            } while (local_a8 != iVar4);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != lVar18);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != iVar3);
  }
  return;
}

Assistant:

void tcd_makelayer(opj_tcd_t *tcd, int layno, double thresh, int final) {
	int compno, resno, bandno, precno, cblkno, passno;
	
	opj_tcd_tile_t *tcd_tile = tcd->tcd_tile;

	tcd_tile->distolayer[layno] = 0;	/* fixed_quality */
	
	for (compno = 0; compno < tcd_tile->numcomps; compno++) {
		opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];
		for (resno = 0; resno < tilec->numresolutions; resno++) {
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];
			for (bandno = 0; bandno < res->numbands; bandno++) {
				opj_tcd_band_t *band = &res->bands[bandno];
				for (precno = 0; precno < res->pw * res->ph; precno++) {
					opj_tcd_precinct_t *prc = &band->precincts[precno];
					for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
						opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
						opj_tcd_layer_t *layer = &cblk->layers[layno];
						
						int n;
						if (layno == 0) {
							cblk->numpassesinlayers = 0;
						}
						n = cblk->numpassesinlayers;
						for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
							int dr;
							double dd;
							opj_tcd_pass_t *pass = &cblk->passes[passno];
							if (n == 0) {
								dr = pass->rate;
								dd = pass->distortiondec;
							} else {
								dr = pass->rate - cblk->passes[n - 1].rate;
								dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
							}
							if (!dr) {
								if (dd != 0)
									n = passno + 1;
								continue;
							}
							if (dd / dr >= thresh)
								n = passno + 1;
						}
						layer->numpasses = n - cblk->numpassesinlayers;
						
						if (!layer->numpasses) {
							layer->disto = 0;
							continue;
						}
						if (cblk->numpassesinlayers == 0) {
							layer->len = cblk->passes[n - 1].rate;
							layer->data = cblk->data;
							layer->disto = cblk->passes[n - 1].distortiondec;
						} else {
							layer->len = cblk->passes[n - 1].rate -	cblk->passes[cblk->numpassesinlayers - 1].rate;
							layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
							layer->disto = cblk->passes[n - 1].distortiondec - cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
						}
						
						tcd_tile->distolayer[layno] += layer->disto;	/* fixed_quality */
						
						if (final)
							cblk->numpassesinlayers = n;
					}
				}
			}
		}
	}
}